

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O0

void __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::append
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,DLPSV *elem)

{
  DLPSV *pDVar1;
  DLPSV **ppDVar2;
  DLPSV *in_RSI;
  IdList<soplex::SVSetBase<double>::DLPSV> *in_RDI;
  
  pDVar1 = last(in_RDI);
  if (pDVar1 == (DLPSV *)0x0) {
    (in_RDI->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first = in_RSI;
  }
  else {
    pDVar1 = last(in_RDI);
    ppDVar2 = SVSetBase<double>::DLPSV::next(pDVar1);
    *ppDVar2 = in_RSI;
    pDVar1 = last(in_RDI);
    ppDVar2 = SVSetBase<double>::DLPSV::prev(in_RSI);
    *ppDVar2 = pDVar1;
  }
  (in_RDI->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last = in_RSI;
  return;
}

Assistant:

void append(T* elem)
   {
      if(last())
      {
         last()->next() = elem;
         elem->prev() = last();
      }
      else
         this->the_first = elem;

      this->the_last = elem;
   }